

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.cpp
# Opt level: O2

void __thiscall
StringifyTest_FilterReturn_Test::StringifyTest_FilterReturn_Test
          (StringifyTest_FilterReturn_Test *this)

{
  PrintTest::PrintTest(&this->super_StringifyTest);
  (this->super_StringifyTest).super_Test._vptr_Test = (_func_int **)&PTR__Test_002bd1a0;
  return;
}

Assistant:

TEST_F(StringifyTest, FilterReturn) {
  static auto branchesModuleText = R"wasm(
  (module
    (func $a (result i32)
      (return (i32.const 0))
    )
    (func $b (result i32)
      (return (i32.const 0))
    )
   )
  )wasm";
  Module wasm;
  parseWast(wasm, branchesModuleText);
  HashStringifyWalker stringify = HashStringifyWalker();
  stringify.walkModule(&wasm);
  auto substrings = StringifyProcessor::repeatSubstrings(stringify.hashString);
  auto result = StringifyProcessor::filterBranches(substrings, stringify.exprs);

  EXPECT_EQ(result, (std::vector<SuffixTree::RepeatedSubstring>{}));
}